

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O1

int32_t ustrcase_internalToTitle_63
                  (int32_t caseLocale,uint32_t options,BreakIterator *iter,UChar *dest,
                  int32_t destCapacity,UChar *src,int32_t srcLength,Edits *edits,
                  UErrorCode *errorCode)

{
  int srcLimit;
  byte bVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint local_a8;
  ulong local_a0;
  UChar *s;
  UCaseContext csc;
  
  local_a8 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((~options & 0x600) != 0) {
      csc.start = 0;
      csc.index = 0;
      csc.cpLimit = 0;
      csc.dir = '\0';
      csc.b1 = '\0';
      csc.b2 = '\0';
      csc.b3 = '\0';
      csc.cpStart = 0;
      csc.limit = srcLength;
      iVar9 = 0;
      lVar5 = 0x50;
      local_a0 = 0;
      csc.p = src;
LAB_0018733b:
      uVar4 = (uint)local_a0;
      if (srcLength <= iVar9) {
        if (U_ZERO_ERROR < *errorCode) {
          return uVar4;
        }
        if (destCapacity < (int)uVar4) {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
          return uVar4;
        }
        if (edits == (Edits *)0x0) {
          return uVar4;
        }
        icu_63::Edits::copyErrorTo(edits,errorCode);
        return uVar4;
      }
      iVar2 = (**(code **)((long)(iter->super_UObject)._vptr_UObject + lVar5))(iter);
      srcLimit = srcLength;
      if (iVar2 < srcLength) {
        srcLimit = iVar2;
      }
      if (iVar2 == -1) {
        srcLimit = srcLength;
      }
      bVar8 = true;
      if (iVar9 < srcLimit) {
        iVar2 = iVar9 + 1;
        uVar6 = (uint)(ushort)src[iVar9];
        if ((((uVar6 & 0xfc00) == 0xd800) && (iVar2 != srcLimit)) &&
           (lVar5 = (long)iVar2, ((ushort)src[lVar5] & 0xfc00) == 0xdc00)) {
          iVar2 = iVar9 + 2;
          uVar6 = (uint)(ushort)src[iVar9] * 0x400 + (uint)(ushort)src[lVar5] + 0xfca02400;
        }
        iVar7 = iVar9;
        if ((options >> 9 & 1) == 0) {
          iVar10 = iVar2;
LAB_001873e3:
          iVar2 = iVar10;
          if ((options >> 10 & 1) == 0) {
            bVar1 = u_charType_63(uVar6);
            if ((0xf020e2eU >> (bVar1 & 0x1f) & 1) != 0) goto LAB_0018747a;
            if (bVar1 == 4) goto LAB_00187406;
          }
          else {
LAB_00187406:
            iVar3 = ucase_getType_63(uVar6);
            if (iVar3 != 0) goto LAB_0018747a;
          }
          iVar7 = iVar2;
          if (iVar2 == srcLimit) goto LAB_0018747a;
          iVar10 = iVar2 + 1;
          uVar6 = (uint)(ushort)src[iVar2];
          if ((((uVar6 & 0xfc00) == 0xd800) && (iVar10 != srcLimit)) &&
             (((ushort)src[iVar10] & 0xfc00) == 0xdc00)) {
            uVar6 = uVar6 * 0x400 + (uint)(ushort)src[iVar10] + 0xfca02400;
            iVar10 = iVar2 + 2;
          }
          goto LAB_001873e3;
        }
        goto LAB_00187528;
      }
      goto LAB_001877b3;
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
LAB_0018747a:
  bVar8 = true;
  iVar10 = iVar7 - iVar9;
  if (iVar10 != 0 && iVar9 <= iVar7) {
    if (iVar10 != 0 && iVar9 <= iVar7) {
      if (edits != (Edits *)0x0) {
        icu_63::Edits::addUnchanged(edits,iVar10);
      }
      if ((((options >> 0xe & 1) == 0) &&
          (local_a0 = 0xffffffff, iVar10 <= (int)(uVar4 ^ 0x7fffffff))) &&
         (local_a0 = (ulong)(iVar10 + uVar4), (int)(iVar10 + uVar4) <= destCapacity)) {
        u_memcpy_63(dest + (int)uVar4,src + iVar9,iVar10);
      }
    }
    if ((int)local_a0 < 0) {
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      local_a8 = 0;
      bVar8 = false;
    }
  }
  if (!bVar8) {
    bVar8 = false;
    goto LAB_00187798;
  }
LAB_00187528:
  bVar8 = true;
  if (iVar2 - iVar7 == 0 || iVar2 < iVar7) goto LAB_00187798;
  csc.cpStart = iVar7;
  csc.cpLimit = iVar2;
  iVar3 = ucase_toFullTitle_63
                    (uVar6,icu_63::anon_unknown_10::utf16_caseContextIterator,&csc,&s,caseLocale);
  uVar4 = icu_63::anon_unknown_10::appendResult
                    (dest,(int32_t)local_a0,destCapacity,iVar3,s,iVar2 - iVar7,options,edits);
  local_a0 = (ulong)uVar4;
  if ((int)uVar4 < 0) {
    *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    local_a8 = 0;
    bVar8 = false;
    goto LAB_00187798;
  }
  if (((caseLocale == 5) && (iVar7 + 1 < srcLimit)) && ((UChar)(src[iVar7] | 0x20U) == 0x69)) {
    if (src[iVar7 + 1] == L'J') {
      if (edits != (Edits *)0x0) {
        icu_63::Edits::addUnchanged(edits,1);
      }
      if ((((options >> 0xe & 1) == 0) && (local_a0 = 0xffffffff, uVar4 != 0x7fffffff)) &&
         (local_a0 = (ulong)(uVar4 + 1), (int)uVar4 < destCapacity)) {
        u_memcpy_63(dest + uVar4,src + (long)iVar7 + 1,1);
      }
      if (-1 < (int)local_a0) {
        iVar2 = iVar2 + 1;
        goto LAB_001876ab;
      }
    }
    else {
      if (src[iVar7 + 1] != L'j') goto LAB_001876ab;
      if ((int)uVar4 < destCapacity) {
        dest[uVar4] = L'J';
LAB_001877fb:
        local_a0 = (ulong)(uVar4 + 1);
      }
      else {
        local_a0 = 0xffffffff;
        if (uVar4 != 0x7fffffff) goto LAB_001877fb;
      }
      if (-1 < (int)local_a0) {
        if (edits != (Edits *)0x0) {
          icu_63::Edits::addReplace(edits,1,1);
        }
        iVar2 = iVar2 + 1;
        goto LAB_001876ab;
      }
    }
    *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  else {
LAB_001876ab:
    bVar8 = true;
    if (srcLimit <= iVar2) goto LAB_00187798;
    uVar4 = (uint)local_a0;
    if ((options >> 8 & 1) == 0) {
      iVar3 = icu_63::anon_unknown_10::toLower
                        (caseLocale,options,dest + local_a0,destCapacity - uVar4,src,&csc,iVar2,
                         srcLimit,edits,errorCode);
      if (*errorCode == U_BUFFER_OVERFLOW_ERROR) {
        *errorCode = U_ZERO_ERROR;
      }
      local_a0 = (ulong)(uVar4 + iVar3);
      bVar8 = *errorCode < U_ILLEGAL_ARGUMENT_ERROR;
      if (U_ZERO_ERROR < *errorCode) {
        local_a8 = uVar4 + iVar3;
      }
      goto LAB_00187798;
    }
    iVar7 = srcLimit - iVar2;
    uVar6 = uVar4;
    if (iVar7 != 0 && iVar2 <= srcLimit) {
      if (edits != (Edits *)0x0) {
        icu_63::Edits::addUnchanged(edits,iVar7);
      }
      if ((((options >> 0xe & 1) == 0) && (uVar6 = 0xffffffff, iVar7 <= (int)(uVar4 ^ 0x7fffffff)))
         && (uVar6 = iVar7 + uVar4, (int)uVar6 <= destCapacity)) {
        u_memcpy_63(dest + local_a0,src + iVar2,iVar7);
      }
    }
    if (-1 < (int)uVar6) {
      local_a0 = (ulong)uVar6;
      goto LAB_00187798;
    }
    *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    local_a0 = (ulong)uVar6;
  }
  local_a8 = 0;
  bVar8 = false;
LAB_00187798:
  if (!bVar8) {
    srcLimit = iVar9;
  }
LAB_001877b3:
  iVar9 = srcLimit;
  lVar5 = 0x68;
  if (!bVar8) {
    return local_a8;
  }
  goto LAB_0018733b;
}

Assistant:

U_CFUNC int32_t U_CALLCONV
ustrcase_internalToTitle(int32_t caseLocale, uint32_t options, BreakIterator *iter,
                         UChar *dest, int32_t destCapacity,
                         const UChar *src, int32_t srcLength,
                         icu::Edits *edits,
                         UErrorCode &errorCode) {
    if (!ustrcase_checkTitleAdjustmentOptions(options, errorCode)) {
        return 0;
    }

    /* set up local variables */
    UCaseContext csc=UCASECONTEXT_INITIALIZER;
    csc.p=(void *)src;
    csc.limit=srcLength;
    int32_t destIndex=0;
    int32_t prev=0;
    UBool isFirstIndex=TRUE;

    /* titlecasing loop */
    while(prev<srcLength) {
        /* find next index where to titlecase */
        int32_t index;
        if(isFirstIndex) {
            isFirstIndex=FALSE;
            index=iter->first();
        } else {
            index=iter->next();
        }
        if(index==UBRK_DONE || index>srcLength) {
            index=srcLength;
        }

        /*
         * Segment [prev..index[ into 3 parts:
         * a) skipped characters (copy as-is) [prev..titleStart[
         * b) first letter (titlecase)              [titleStart..titleLimit[
         * c) subsequent characters (lowercase)                 [titleLimit..index[
         */
        if(prev<index) {
            // Find and copy skipped characters [prev..titleStart[
            int32_t titleStart=prev;
            int32_t titleLimit=prev;
            UChar32 c;
            U16_NEXT(src, titleLimit, index, c);
            if ((options&U_TITLECASE_NO_BREAK_ADJUSTMENT)==0) {
                // Adjust the titlecasing index to the next cased character,
                // or to the next letter/number/symbol/private use.
                // Stop with titleStart<titleLimit<=index
                // if there is a character to be titlecased,
                // or else stop with titleStart==titleLimit==index.
                UBool toCased = (options&U_TITLECASE_ADJUST_TO_CASED) != 0;
                while (toCased ? UCASE_NONE==ucase_getType(c) : !ustrcase_isLNS(c)) {
                    titleStart=titleLimit;
                    if(titleLimit==index) {
                        break;
                    }
                    U16_NEXT(src, titleLimit, index, c);
                }
                if (prev < titleStart) {
                    destIndex=appendUnchanged(dest, destIndex, destCapacity,
                                              src+prev, titleStart-prev, options, edits);
                    if(destIndex<0) {
                        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                        return 0;
                    }
                }
            }

            if(titleStart<titleLimit) {
                /* titlecase c which is from [titleStart..titleLimit[ */
                csc.cpStart=titleStart;
                csc.cpLimit=titleLimit;
                const UChar *s;
                c=ucase_toFullTitle(c, utf16_caseContextIterator, &csc, &s, caseLocale);
                destIndex=appendResult(dest, destIndex, destCapacity, c, s,
                                       titleLimit-titleStart, options, edits);
                if(destIndex<0) {
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }

                /* Special case Dutch IJ titlecasing */
                if (titleStart+1 < index &&
                        caseLocale == UCASE_LOC_DUTCH &&
                        (src[titleStart] == 0x0049 || src[titleStart] == 0x0069)) {
                    if (src[titleStart+1] == 0x006A) {
                        destIndex=appendUChar(dest, destIndex, destCapacity, 0x004A);
                        if(destIndex<0) {
                            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                            return 0;
                        }
                        if(edits!=NULL) {
                            edits->addReplace(1, 1);
                        }
                        titleLimit++;
                    } else if (src[titleStart+1] == 0x004A) {
                        // Keep the capital J from getting lowercased.
                        destIndex=appendUnchanged(dest, destIndex, destCapacity,
                                                  src+titleStart+1, 1, options, edits);
                        if(destIndex<0) {
                            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                            return 0;
                        }
                        titleLimit++;
                    }
                }

                /* lowercase [titleLimit..index[ */
                if(titleLimit<index) {
                    if((options&U_TITLECASE_NO_LOWERCASE)==0) {
                        /* Normal operation: Lowercase the rest of the word. */
                        destIndex+=
                            toLower(
                                caseLocale, options,
                                dest+destIndex, destCapacity-destIndex,
                                src, &csc, titleLimit, index,
                                edits, errorCode);
                        if(errorCode==U_BUFFER_OVERFLOW_ERROR) {
                            errorCode=U_ZERO_ERROR;
                        }
                        if(U_FAILURE(errorCode)) {
                            return destIndex;
                        }
                    } else {
                        /* Optionally just copy the rest of the word unchanged. */
                        destIndex=appendUnchanged(dest, destIndex, destCapacity,
                                                  src+titleLimit, index-titleLimit, options, edits);
                        if(destIndex<0) {
                            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                            return 0;
                        }
                    }
                }
            }
        }

        prev=index;
    }

    return checkOverflowAndEditsError(destIndex, destCapacity, edits, errorCode);
}